

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

char * __thiscall fmt::v11::detail::allocator<char>::allocate(allocator<char> *this,size_t n)

{
  char *pcVar1;
  undefined8 *puVar2;
  
  pcVar1 = (char *)malloc(n);
  if (pcVar1 != (char *)0x0) {
    return pcVar1;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = std::__throw_system_error;
  __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

T* allocate(size_t n) {
    FMT_ASSERT(n <= max_value<size_t>() / sizeof(T), "");
    T* p = static_cast<T*>(malloc(n * sizeof(T)));
    if (!p) FMT_THROW(std::bad_alloc());
    return p;
  }